

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O3

string * __thiscall
google::protobuf::Reflection::GetStringReference
          (Reflection *this,Message *message,FieldDescriptor *field,string *scratch)

{
  ReflectionSchema *this_00;
  byte bVar1;
  Descriptor *pDVar2;
  void *pvVar3;
  bool bVar4;
  uint32_t uVar5;
  CppStringType CVar6;
  Cord **ppCVar7;
  string *psVar8;
  ArenaStringPtr *pAVar9;
  Cord *src;
  char *description;
  OneofDescriptor *oneof_descriptor;
  Metadata MVar10;
  
  MVar10 = Message::GetMetadata(message);
  if (MVar10.reflection != this) {
LAB_0029cb75:
    pDVar2 = this->descriptor_;
    MVar10 = Message::GetMetadata(message);
    anon_unknown_6::ReportReflectionUsageMessageError
              (pDVar2,MVar10.descriptor,field,"GetStringReference");
  }
  pDVar2 = this->descriptor_;
  if (field->containing_type_ != pDVar2) {
    description = "Field does not match message type.";
LAB_0029cbb4:
    anon_unknown_6::ReportReflectionUsageError(pDVar2,field,"GetStringReference",description);
  }
  bVar1 = field->field_0x1;
  if (0xbf < bVar1 != (bool)((bVar1 & 0x20) >> 5)) {
    GetStringReference();
    goto LAB_0029cb75;
  }
  if ((bVar1 & 0x20) != 0) {
    description = "Field is repeated; the method requires a singular field.";
    goto LAB_0029cbb4;
  }
  if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)field->type_ * 4) != 9) {
    anon_unknown_6::ReportReflectionUsageTypeError(pDVar2,field,"GetStringReference",CPPTYPE_STRING)
    ;
  }
  this_00 = &this->schema_;
  if ((bVar1 & 8) != 0) {
    uVar5 = internal::ReflectionSchema::GetExtensionSetOffset(this_00);
    psVar8 = internal::ExtensionSet::GetString
                       ((ExtensionSet *)
                        ((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar5),
                        field->number_,(field->field_20).default_value_string_);
    return psVar8;
  }
  bVar4 = internal::ReflectionSchema::InRealOneof(this_00,field);
  if (bVar4) {
    if ((field->field_0x1 & 0x10) == 0) {
      oneof_descriptor = (OneofDescriptor *)0x0;
    }
    else {
      oneof_descriptor = (field->scope_).containing_oneof;
      if (oneof_descriptor == (OneofDescriptor *)0x0) goto LAB_0029cbd5;
    }
    uVar5 = GetOneofCase(this,message,oneof_descriptor);
    if (uVar5 != field->number_) goto LAB_0029cb3b;
  }
  CVar6 = FieldDescriptor::cpp_string_type(field);
  if ((CVar6 != kView) && (CVar6 != kString)) {
    if (CVar6 == kCord) {
      bVar4 = internal::ReflectionSchema::InRealOneof(this_00,field);
      if (bVar4) {
        ppCVar7 = GetRaw<absl::lts_20250127::Cord*>(this,message,field);
        src = *ppCVar7;
      }
      else {
        src = GetRaw<absl::lts_20250127::Cord>(this,message,field);
      }
      absl::lts_20250127::CopyCordToString(src,scratch);
      return scratch;
    }
    GetStringReference();
LAB_0029cbd5:
    internal::protobuf_assumption_failed
              ("res != nullptr",
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
               ,0xb31);
  }
  bVar4 = internal::ReflectionSchema::IsFieldInlined(this_00,field);
  if (bVar4) {
    psVar8 = (string *)GetRaw<google::protobuf::internal::InlinedStringField>(this,message,field);
    return psVar8;
  }
  pAVar9 = GetRaw<google::protobuf::internal::ArenaStringPtr>(this,message,field);
  pvVar3 = (pAVar9->tagged_ptr_).ptr_;
  if (((ulong)pvVar3 & 3) != 0) {
    return (string *)((ulong)pvVar3 & 0xfffffffffffffffc);
  }
LAB_0029cb3b:
  return (string *)(field->field_20).default_value_int64_t_;
}

Assistant:

const std::string& Reflection::GetStringReference(const Message& message,
                                                  const FieldDescriptor* field,
                                                  std::string* scratch) const {
  (void)scratch;  // Parameter is used by Google-internal code.
  USAGE_CHECK_ALL(GetStringReference, SINGULAR, STRING);
  if (field->is_extension()) {
    return GetExtensionSet(message).GetString(
        field->number(), internal::DefaultValueStringAsString(field));
  } else {
    if (schema_.InRealOneof(field) && !HasOneofField(message, field)) {
      return internal::DefaultValueStringAsString(field);
    }
    switch (field->cpp_string_type()) {
      case FieldDescriptor::CppStringType::kCord:
        if (schema_.InRealOneof(field)) {
          absl::CopyCordToString(*GetField<absl::Cord*>(message, field),
                                 scratch);
        } else {
          absl::CopyCordToString(GetField<absl::Cord>(message, field), scratch);
        }
        return *scratch;
      case FieldDescriptor::CppStringType::kView:
      case FieldDescriptor::CppStringType::kString:
        if (IsInlined(field)) {
          return GetField<InlinedStringField>(message, field).GetNoArena();
        } else if (IsMicroString(field)) {
          *scratch = std::string(GetField<MicroString>(message, field).Get());
          return *scratch;
        } else {
          const auto& str = GetField<ArenaStringPtr>(message, field);
          return str.IsDefault() ? internal::DefaultValueStringAsString(field)
                                 : str.Get();
        }
    }
    internal::Unreachable();
  }
}